

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  string *value;
  int i;
  int index;
  char *pcVar4;
  SEARCH_METHODS *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertionResult local_68;
  AssertionResult gtest_ar;
  string expected;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar4 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  std::__cxx11::string::string((string *)&expected,pcVar4,(allocator *)&local_68);
  Message::Message((Message *)&local_70);
  value = &this->substr_;
  if ((int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70) == 1) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar2->type_ == TVar1) {
      pcVar4 = strstr((pTVar2->message_)._M_dataplus._M_p,(value->_M_dataplus)._M_p);
      if (pcVar4 != (char *)0x0) {
        gtest_ar.success_ = true;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        goto LAB_0013f3b6;
      }
      local_68.success_ = false;
      local_68.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar3 = AssertionResult::operator<<(&local_68,(char (*) [11])0x41ff6c);
      pAVar3 = AssertionResult::operator<<(pAVar3,&expected);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,value);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x420ad7);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(&gtest_ar,pAVar3);
    }
    else {
      local_68.success_ = false;
      local_68.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar3 = AssertionResult::operator<<(&local_68,(char (*) [11])0x41ff6c);
      pAVar3 = AssertionResult::operator<<(pAVar3,&expected);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x4206da);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(&gtest_ar,pAVar3);
    }
  }
  else {
    std::operator<<((ostream *)(local_70._M_head_impl + 0x10),"Expected: ");
    std::operator<<((ostream *)(local_70._M_head_impl + 0x10),(string *)&expected);
    std::operator<<((ostream *)(local_70._M_head_impl + 0x10),"\n");
    std::operator<<((ostream *)(local_70._M_head_impl + 0x10),"  Actual: ");
    std::ostream::operator<<
              (local_70._M_head_impl + 0x10,
               (int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70));
    std::operator<<((ostream *)(local_70._M_head_impl + 0x10)," failures");
    for (index = 0; index < (int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70);
        index = index + 1) {
      std::operator<<((ostream *)(local_70._M_head_impl + 0x10),"\n");
      pTVar2 = TestPartResultArray::GetTestPartResult(this_00,index);
      testing::operator<<((ostream *)(local_70._M_head_impl + 0x10),pTVar2);
    }
    local_68.success_ = false;
    local_68.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pAVar3 = AssertionResult::operator<<(&local_68,(Message *)&local_70);
    AssertionResult::AssertionResult(&gtest_ar,pAVar3);
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_68.message_);
LAB_0013f3b6:
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&expected);
  if (gtest_ar.success_ == false) {
    Message::Message((Message *)&expected);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/src/gtest.cc"
               ,0x3d9,(char *)message);
    AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&expected);
    AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (expected._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)expected._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)value);
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}